

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::process_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  bool bVar1;
  unsigned_long payload_max_length;
  bool local_13b;
  bool local_13a;
  string local_100;
  int local_e0;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_d0;
  Progress local_b0;
  int local_8c;
  undefined1 auStack_88 [4];
  int dummy_status;
  anon_class_16_2_d8a1a6d3 progress;
  anon_class_16_2_d8a1a6d3 local_70;
  undefined1 local_60 [8];
  ContentReceiverWithProgress out;
  Error *error_local;
  bool close_connection_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  out._M_invoker = (_Invoker_type)error;
  bVar1 = write_request(this,strm,req,close_connection,error);
  if (bVar1) {
    bVar1 = read_response_line(this,strm,req,res);
    if ((bVar1) && (bVar1 = detail::read_headers(strm,&res->headers), bVar1)) {
      bVar1 = std::function::operator_cast_to_bool((function *)&req->response_handler_);
      if ((!bVar1) ||
         (bVar1 = std::function<bool_(const_httplib::Response_&)>::operator()
                            (&req->response_handler_,res), bVar1)) {
        if (((res->status != 0xcc) && (bVar1 = std::operator!=(&req->method,"HEAD"), bVar1)) &&
           (bVar1 = std::operator!=(&req->method,"CONNECT"), bVar1)) {
          bVar1 = std::function::operator_cast_to_bool((function *)&req->content_receiver_);
          if (bVar1) {
            local_70.error = (Error *)out._M_invoker;
            local_70.req = req;
            std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::
            function<httplib::ClientImpl::process_request(httplib::Stream&,httplib::Request_const&,httplib::Response&,bool,httplib::Error&)::_lambda(char_const*,unsigned_long,unsigned_long,unsigned_long)_1_,void>
                      ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                       local_60,&local_70);
          }
          else {
            progress.error = (Error *)res;
            std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::
            function<httplib::ClientImpl::process_request(httplib::Stream&,httplib::Request_const&,httplib::Response&,bool,httplib::Error&)::_lambda(char_const*,unsigned_long,unsigned_long,unsigned_long)_2_,void>
                      ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                       local_60,(anon_class_8_1_ba1d7400 *)&progress.error);
          }
          progress.req = (Request *)out._M_invoker;
          _auStack_88 = req;
          payload_max_length = std::numeric_limits<unsigned_long>::max();
          std::function<bool(unsigned_long,unsigned_long)>::
          function<httplib::ClientImpl::process_request(httplib::Stream&,httplib::Request_const&,httplib::Response&,bool,httplib::Error&)::_lambda(unsigned_long,unsigned_long)_1_,void>
                    ((function<bool(unsigned_long,unsigned_long)> *)&local_b0,
                     (anon_class_16_2_d8a1a6d3 *)auStack_88);
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                    (&local_d0,
                     (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     local_60);
          bVar1 = detail::read_content<httplib::Response>
                            (strm,res,payload_max_length,&local_8c,&local_b0,&local_d0,
                             (bool)(this->decompress_ & 1));
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
                    (&local_d0);
          std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_b0);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_e0 = 0;
          }
          else {
            if (*(int *)out._M_invoker != 7) {
              *(undefined4 *)out._M_invoker = 4;
            }
            this_local._7_1_ = 0;
            local_e0 = 1;
          }
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
                    ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     local_60);
          if (local_e0 != 0) goto LAB_001204fe;
        }
        Response::get_header_value_abi_cxx11_(&local_100,res,"Connection",0);
        bVar1 = std::operator==(&local_100,"close");
        local_13a = true;
        if (!bVar1) {
          bVar1 = std::operator==(&res->version,"HTTP/1.0");
          local_13b = false;
          if (bVar1) {
            local_13b = std::operator!=(&res->reason,"Connection established");
          }
          local_13a = local_13b;
        }
        std::__cxx11::string::~string((string *)&local_100);
        if (local_13a != false) {
          lock_socket_and_shutdown_and_close(this);
        }
        bVar1 = std::function::operator_cast_to_bool((function *)&this->logger_);
        if (bVar1) {
          std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                    (&this->logger_,req,res);
        }
        this_local._7_1_ = 1;
      }
      else {
        *(undefined4 *)out._M_invoker = 7;
        this_local._7_1_ = 0;
      }
    }
    else {
      *(undefined4 *)out._M_invoker = 4;
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001204fe:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool ClientImpl::process_request(Stream &strm, const Request &req,
											Response &res, bool close_connection,
											Error &error) {
		// Send request
		if (!write_request(strm, req, close_connection, error)) { return false; }

		// Receive response and headers
		if (!read_response_line(strm, req, res) ||
			!detail::read_headers(strm, res.headers)) {
			error = Error::Read;
			return false;
		}

		if (req.response_handler_) {
			if (!req.response_handler_(res)) {
				error = Error::Canceled;
				return false;
			}
		}

		// Body
		if ((res.status != 204) && req.method != "HEAD" && req.method != "CONNECT") {
			auto out =
					req.content_receiver_
					? static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t off, uint64_t len) {
								auto ret = req.content_receiver_(buf, n, off, len);
								if (!ret) { error = Error::Canceled; }
								return ret;
							})
					: static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t /*off*/,
								uint64_t /*len*/) {
								if (res.body.size() + n > res.body.max_size()) {
									return false;
								}
								res.body.append(buf, n);
								return true;
							});

			auto progress = [&](uint64_t current, uint64_t total) {
				if (!req.progress_) { return true; }
				auto ret = req.progress_(current, total);
				if (!ret) { error = Error::Canceled; }
				return ret;
			};

			int dummy_status;
			if (!detail::read_content(strm, res, (std::numeric_limits<size_t>::max)(),
									  dummy_status, std::move(progress), std::move(out),
									  decompress_)) {
				if (error != Error::Canceled) { error = Error::Read; }
				return false;
			}
		}

		if (res.get_header_value("Connection") == "close" ||
			(res.version == "HTTP/1.0" && res.reason != "Connection established")) {
			// TODO this requires a not-entirely-obvious chain of calls to be correct
			// for this to be safe. Maybe a code refactor (such as moving this out to
			// the send function and getting rid of the recursiveness of the mutex)
			// could make this more obvious.

			// This is safe to call because process_request is only called by
			// handle_request which is only called by send, which locks the request
			// mutex during the process. It would be a bug to call it from a different
			// thread since it's a thread-safety issue to do these things to the socket
			// if another thread is using the socket.
			lock_socket_and_shutdown_and_close();
		}

		// Log
		if (logger_) { logger_(req, res); }

		return true;
	}